

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::APITest2::verifyGLGetActiveSubroutineUniformNameFunctionality
          (APITest2 *this)

{
  GLchar **value;
  ostringstream *poVar1;
  char *__s1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  GLchar *__s;
  MessageBuilder *pMVar7;
  TestError *this_00;
  GLsizei reported_length;
  undefined1 local_1b0 [384];
  long lVar6;
  
  sVar5 = strlen(this->m_subroutine_uniform_name);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  reported_length = 0;
  (**(code **)(lVar6 + 0x740))(this->m_po_id,0x8b31,0,0,0,0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGetActiveSubroutineUniformName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x812);
  (**(code **)(lVar6 + 0x740))(this->m_po_id,0x8b31,0,0,&reported_length,0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGetActiveSubroutineUniformName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x817);
  if (reported_length == 0) {
    iVar2 = (int)sVar5;
    iVar4 = iVar2 + 1;
    __s = (GLchar *)operator_new__((long)iVar4);
    this->m_buffer = __s;
    memset(__s,0,(long)iVar4);
    (**(code **)(lVar6 + 0x740))(this->m_po_id,0x8b31,0,iVar4,&reported_length,__s);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"getActiveSubroutineUniformName() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x829);
    if (reported_length == iVar2) {
      value = &this->m_buffer;
      __s1 = *value;
      iVar2 = strcmp(__s1,this->m_subroutine_uniform_name);
      if (iVar2 == 0) {
        if (__s1 != (char *)0x0) {
          operator_delete__(__s1);
        }
        *value = (GLchar *)0x0;
        return;
      }
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Invalid active subroutine uniform name reported:[");
      pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "] instead of:[");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_subroutine_uniform_name);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid active subroutine uniform name reported.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x83b);
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Invalid active subroutine uniform name length reported:");
      std::ostream::operator<<(poVar1,reported_length);
      std::operator<<((ostream *)poVar1,", instead of: ");
      std::ostream::operator<<(poVar1,iVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Incorrect length of active subroutine uniform name",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x831);
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid active subroutine uniform name length reported:");
    std::ostream::operator<<(poVar1,reported_length);
    std::operator<<((ostream *)poVar1,", instead of: ");
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Incorrect length of active subroutine uniform name",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x821);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void APITest2::verifyGLGetActiveSubroutineUniformNameFunctionality()
{
	GLsizei				  expected_length = (GLsizei)strlen(m_subroutine_uniform_name);
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	GLsizei				  reported_length = 0;

	gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, 0, /* index */
									  0,							/* bufsize */
									  DE_NULL,						/* length */
									  DE_NULL);						/* name */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineUniformName() call failed.");

	gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, 0, /* index */
									  0,							/* bufsize */
									  &reported_length, DE_NULL);   /* name */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineUniformName() call failed.");

	// reported_length is the actual number of characters written into <name>
	// If <bufSize> is 0, reported_length should be 0
	if (reported_length != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid active subroutine uniform name length reported:" << reported_length
						   << ", instead of: " << 0 << tcu::TestLog::EndMessage;

		TCU_FAIL("Incorrect length of active subroutine uniform name");
	}

	m_buffer = new glw::GLchar[expected_length + 1];

	memset(m_buffer, 0, expected_length + 1);

	gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, 0, expected_length + 1, &reported_length, m_buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getActiveSubroutineUniformName() call failed.");

	if (reported_length != expected_length)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid active subroutine uniform name length reported:" << reported_length
						   << ", instead of: " << expected_length << tcu::TestLog::EndMessage;

		TCU_FAIL("Incorrect length of active subroutine uniform name");
	}

	if (strcmp(m_buffer, m_subroutine_uniform_name) != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid active subroutine uniform name reported:[" << m_buffer
						   << "]"
							  " instead of:["
						   << m_subroutine_uniform_name << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid active subroutine uniform name reported.");
	}

	delete[] m_buffer;
	m_buffer = DE_NULL;
}